

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToTheWoleList_Test::testBody
          (TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToTheWoleList_Test
           *this)

{
  MockCheckedExpectedCall *pMVar1;
  MockExpectedCallsList *pMVar2;
  uint uVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_28;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call1;
  SimpleString::SimpleString(&local_28,"relate");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_28);
  SimpleString::~SimpleString(&local_28);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call2;
  SimpleString::SimpleString(&local_28,"relate");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_28);
  SimpleString::~SimpleString(&local_28);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call3;
  SimpleString::SimpleString(&local_28,"relate");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_28);
  SimpleString::~SimpleString(&local_28);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call1);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call2);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call3);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).list;
  SimpleString::SimpleString(&local_28,"unrelate");
  (*pMVar2->_vptr_MockExpectedCallsList[0x11])(pMVar2,&local_28);
  SimpleString::~SimpleString(&local_28);
  pUVar4 = UtestShell::getCurrent();
  uVar3 = (*((this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).list)->
            _vptr_MockExpectedCallsList[3])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0,(ulong)uVar3,"LONGS_EQUAL(0, list->size()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/ExpectedFunctionsListTest.cpp"
             ,0x95,pTVar5);
  return;
}

Assistant:

TEST(MockExpectedCallsList, removeAllExpectationsExceptThisThatRelateToTheWoleList)
{
    call1->withName("relate");
    call2->withName("relate");
    call3->withName("relate");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->addExpectedCall(call3);
    list->onlyKeepExpectationsRelatedTo("unrelate");
    LONGS_EQUAL(0, list->size());
}